

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundedQueue.h
# Opt level: O1

void __thiscall Glucose::bqueue<unsigned_int>::initSize(bqueue<unsigned_int> *this,int size)

{
  vec<unsigned_int>::growTo(&this->elems,size);
  this->first = 0;
  this->last = 0;
  this->maxsize = size;
  this->queuesize = 0;
  if (0 < size) {
    memset((this->elems).data,0,(ulong)(uint)size << 2);
  }
  this->exp = 2.0 / (double)(size + 1);
  return;
}

Assistant:

void initSize(int size) {growTo(size);exp = 2.0/(size+1);}